

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O2

void test_value_ctor(void)

{
  uint __line;
  reference_type piVar1;
  reference_type piVar2;
  char *__assertion;
  compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,__1>_> local_10;
  compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,__1>_> local_c;
  opt_int oi0;
  opt_int oi1;
  
  local_10.super_type.value_ = (type)0;
  local_c.super_type.value_ = (type)1;
  piVar1 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_-1>_>::value
                     (&local_10);
  if (*piVar1 == 0) {
    piVar1 = ak_toolbox::compact_optional_ns::detail_::
             compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_-1>_>::value
                       (&local_c);
    if (*piVar1 == 1) {
      local_10.super_type.value_ = (type)-1;
      local_c.super_type.value_ = (type)1;
      piVar2 = ak_toolbox::compact_optional_ns::detail_::
               compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>::value
                         ((compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>
                           *)&local_10);
      if (*piVar2 == -1) {
        piVar2 = ak_toolbox::compact_optional_ns::detail_::
                 compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>::value
                           ((compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>
                             *)&local_c);
        if (*piVar2 == 1) {
          return;
        }
        __assertion = "oi1.value() == 1";
        __line = 0x30;
      }
      else {
        __assertion = "oiN1.value() == -1";
        __line = 0x2f;
      }
    }
    else {
      __assertion = "oi1.value() == 1";
      __line = 0x24;
    }
  }
  else {
    __assertion = "oi0.value() == 0";
    __line = 0x23;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,__line,"void test_value_ctor()");
}

Assistant:

void test_value_ctor()
{
  {
    typedef compact_optional< evp_int<int, -1> > opt_int;
    static_assert (sizeof(opt_int) == sizeof(int), "size waste");
    
    opt_int oi_, oiN1(-1), oi0(0), oi1(1);
    assert (!oi_.has_value());
    assert (!oiN1.has_value());
    assert ( oi0.has_value());
    assert ( oi1.has_value());
    
    assert (oi0.value() == 0);
    assert (oi1.value() == 1);
  }
  {
    typedef compact_optional< evp_int<int, 0> > opt_int;
    static_assert (sizeof(opt_int) == sizeof(int), "size waste");
    opt_int oi_, oiN1(-1), oi0(0), oi1(1);
    assert (!oi_.has_value());
    assert ( oiN1.has_value());
    assert (!oi0.has_value());
    assert ( oi1.has_value());
    
    assert (oiN1.value() == -1);
    assert (oi1.value() == 1);
  }
}